

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O0

void WebRtcSpl_Resample22khzTo8khz
               (int16_t *in,int16_t *out,WebRtcSpl_State22khzTo8khz *state,int32_t *tmpmem)

{
  int local_2c;
  int k;
  int32_t *tmpmem_local;
  WebRtcSpl_State22khzTo8khz *state_local;
  int16_t *out_local;
  int16_t *in_local;
  
  state_local = (WebRtcSpl_State22khzTo8khz *)out;
  out_local = in;
  for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
    WebRtcSpl_LPBy2ShortToInt(out_local,0x6e,tmpmem + 0x10,state->S_22_22);
    tmpmem[8] = state->S_22_16[0];
    tmpmem[9] = state->S_22_16[1];
    tmpmem[10] = state->S_22_16[2];
    tmpmem[0xb] = state->S_22_16[3];
    tmpmem[0xc] = state->S_22_16[4];
    tmpmem[0xd] = state->S_22_16[5];
    tmpmem[0xe] = state->S_22_16[6];
    tmpmem[0xf] = state->S_22_16[7];
    state->S_22_16[0] = tmpmem[0x76];
    state->S_22_16[1] = tmpmem[0x77];
    state->S_22_16[2] = tmpmem[0x78];
    state->S_22_16[3] = tmpmem[0x79];
    state->S_22_16[4] = tmpmem[0x7a];
    state->S_22_16[5] = tmpmem[0x7b];
    state->S_22_16[6] = tmpmem[0x7c];
    state->S_22_16[7] = tmpmem[0x7d];
    WebRtcSpl_Resample44khzTo32khz(tmpmem + 8,tmpmem,10);
    WebRtcSpl_DownBy2IntToShort(tmpmem,0x50,(int16_t *)state_local,state->S_16_8);
    out_local = out_local + 0x6e;
    state_local = (WebRtcSpl_State22khzTo8khz *)(state_local->S_22_16 + 4);
  }
  return;
}

Assistant:

void WebRtcSpl_Resample22khzTo8khz(const int16_t* in, int16_t* out,
                                   WebRtcSpl_State22khzTo8khz* state, int32_t* tmpmem)
{
    int k;

    // process two blocks of 10/SUB_BLOCKS_22_8 ms (to reduce temp buffer size)
    for (k = 0; k < SUB_BLOCKS_22_8; k++)
    {
        ///// 22 --> 22 lowpass /////
        // int16_t  in[220/SUB_BLOCKS_22_8]
        // int32_t out[220/SUB_BLOCKS_22_8]
        /////
        WebRtcSpl_LPBy2ShortToInt(in, 220 / SUB_BLOCKS_22_8, tmpmem + 16, state->S_22_22);

        ///// 22 --> 16 /////
        // int32_t  in[220/SUB_BLOCKS_22_8]
        // int32_t out[160/SUB_BLOCKS_22_8]
        /////
        // copy state to and from input array
        tmpmem[8] = state->S_22_16[0];
        tmpmem[9] = state->S_22_16[1];
        tmpmem[10] = state->S_22_16[2];
        tmpmem[11] = state->S_22_16[3];
        tmpmem[12] = state->S_22_16[4];
        tmpmem[13] = state->S_22_16[5];
        tmpmem[14] = state->S_22_16[6];
        tmpmem[15] = state->S_22_16[7];
        state->S_22_16[0] = tmpmem[220 / SUB_BLOCKS_22_8 + 8];
        state->S_22_16[1] = tmpmem[220 / SUB_BLOCKS_22_8 + 9];
        state->S_22_16[2] = tmpmem[220 / SUB_BLOCKS_22_8 + 10];
        state->S_22_16[3] = tmpmem[220 / SUB_BLOCKS_22_8 + 11];
        state->S_22_16[4] = tmpmem[220 / SUB_BLOCKS_22_8 + 12];
        state->S_22_16[5] = tmpmem[220 / SUB_BLOCKS_22_8 + 13];
        state->S_22_16[6] = tmpmem[220 / SUB_BLOCKS_22_8 + 14];
        state->S_22_16[7] = tmpmem[220 / SUB_BLOCKS_22_8 + 15];

        WebRtcSpl_Resample44khzTo32khz(tmpmem + 8, tmpmem, 20 / SUB_BLOCKS_22_8);

        ///// 16 --> 8 /////
        // int32_t in[160/SUB_BLOCKS_22_8]
        // int32_t out[80/SUB_BLOCKS_22_8]
        /////
        WebRtcSpl_DownBy2IntToShort(tmpmem, 160 / SUB_BLOCKS_22_8, out, state->S_16_8);

        // move input/output pointers 10/SUB_BLOCKS_22_8 ms seconds ahead
        in += 220 / SUB_BLOCKS_22_8;
        out += 80 / SUB_BLOCKS_22_8;
    }
}